

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

int Kit_TruthStats(uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Kit_Graph_t *pGraph;
  
  pGraph = Kit_TruthToGraph(pTruth,nVars,vMemory);
  iVar1 = pGraph->nSize;
  iVar2 = pGraph->nLeaves;
  iVar3 = Kit_GraphLevelNum_rec(pGraph,pGraph->pNodes + (long)iVar1 + -1);
  Kit_GraphFree(pGraph);
  return iVar3 << 0x10 | iVar1 - iVar2;
}

Assistant:

int Kit_TruthStats( unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    int nNodes  = Kit_GraphNodeNum( pGraph );
    int nLevels = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeLast(pGraph) );
    Kit_GraphFree( pGraph );
    return (nLevels << 16) | nNodes;
}